

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O0

int vector_reserve(vector v,size_t capacity)

{
  void *pvVar1;
  ulong in_RSI;
  long *in_RDI;
  void *data;
  ulong local_18;
  int local_4;
  
  if ((in_RDI == (long *)0x0) || (in_RSI == in_RDI[1])) {
    local_4 = 1;
  }
  else {
    local_18 = in_RSI;
    if (in_RSI < 0x10) {
      local_18 = 0x10;
    }
    pvVar1 = realloc((void *)in_RDI[3],local_18 * *in_RDI);
    if (pvVar1 == (void *)0x0) {
      log_write_impl_va("metacall",0xa5,"vector_reserve",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                        ,LOG_LEVEL_ERROR,"Vector reallocation error");
      local_4 = 1;
    }
    else {
      if (local_18 < (ulong)in_RDI[2]) {
        in_RDI[2] = local_18;
      }
      in_RDI[3] = (long)pvVar1;
      in_RDI[1] = local_18;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int vector_reserve(vector v, size_t capacity)
{
	if (v != NULL && capacity != v->capacity)
	{
		register void *data;

		if (capacity < VECTOR_CAPACITY_MIN)
		{
			capacity = VECTOR_CAPACITY_MIN;
		}

		data = realloc(v->data, capacity * v->type_size);

		if (data == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Vector reallocation error");

			return 1;
		}

		if (capacity < v->size)
		{
			v->size = capacity;
		}

		v->data = data;

		v->capacity = capacity;

		return 0;
	}

	return 1;
}